

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O3

RuleScanRecord * __thiscall
anon_unknown.dwarf_1c9774::BuildEngineImpl::newRuleScanRecord(BuildEngineImpl *this)

{
  pointer ppRVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  ulong *puVar5;
  RuleScanRecord *pRVar6;
  ulong uVar7;
  
  ppRVar1 = (this->freeRuleScanRecords).
            super__Vector_base<(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->freeRuleScanRecords).
      super__Vector_base<(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>_>
      ._M_impl.super__Vector_impl_data._M_start == ppRVar1) {
    pRVar6 = this->currentBlockPos;
    if (pRVar6 == this->currentBlockEnd) {
      uVar2 = this->numScanRecordsPerBlock;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar2;
      uVar4 = SUB168(auVar3 * ZEXT816(0x30),0);
      uVar7 = 0xffffffffffffffff;
      if (SUB168(auVar3 * ZEXT816(0x30),8) == 0) {
        uVar7 = uVar4 | 8;
      }
      puVar5 = (ulong *)operator_new__(uVar7);
      *puVar5 = uVar2;
      if (uVar2 != 0) {
        memset((RuleScanRecord *)(puVar5 + 1),0,((uVar4 - 0x30) / 0x30) * 0x30 + 0x30);
      }
      this->currentBlockPos = (RuleScanRecord *)(puVar5 + 1);
      std::
      vector<(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>_>
      ::push_back(&this->ruleScanRecordBlocks,&this->currentBlockPos);
      pRVar6 = this->currentBlockPos;
      this->currentBlockEnd = pRVar6 + this->numScanRecordsPerBlock;
    }
    this->currentBlockPos = pRVar6 + 1;
  }
  else {
    pRVar6 = ppRVar1[-1];
    (this->freeRuleScanRecords).
    super__Vector_base<(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppRVar1 + -1;
  }
  return pRVar6;
}

Assistant:

RuleScanRecord* newRuleScanRecord() {
    // If we have an item on the free list, return it.
    if (!freeRuleScanRecords.empty()) {
      auto result = freeRuleScanRecords.back();
      freeRuleScanRecords.pop_back();
      return result;
    }

    // If we are at the end of a block, allocate a new one.
    if (currentBlockPos == currentBlockEnd) {
      currentBlockPos = new RuleScanRecord[numScanRecordsPerBlock];
      ruleScanRecordBlocks.push_back(currentBlockPos);
      currentBlockEnd = currentBlockPos + numScanRecordsPerBlock;
    }
    return currentBlockPos++;
  }